

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

KindedSources * __thiscall
cmGeneratorTarget::GetKindedSources(cmGeneratorTarget *this,string *config)

{
  cmake *this_00;
  iterator iVar1;
  ostream *poVar2;
  cmListFileBacktrace *r;
  KindedSources *files;
  string key;
  ostringstream e;
  string local_1f8;
  string local_1d8;
  cmListFileBacktrace local_1b8;
  undefined1 local_198 [376];
  
  if (this->LinkImplementationLanguageIsContextDependent == false) {
    files = (KindedSources *)
            ((this->KindedSourcesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 2);
  }
  else {
    cmsys::SystemTools::UpperCase(&local_1d8,config);
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>_>
            ::find(&(this->KindedSourcesMap)._M_t,&local_1d8);
    if ((_Rb_tree_header *)iVar1._M_node ==
        &(this->KindedSourcesMap)._M_t._M_impl.super__Rb_tree_header) {
      files = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>_>
              ::operator[](&this->KindedSourcesMap,&local_1d8);
      ComputeKindedSources(this,files,config);
      files->Initialized = true;
    }
    else if (*(char *)&iVar1._M_node[7]._M_parent == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"The SOURCES of \"",0x10);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,(this->Target->Name)._M_dataplus._M_p,
                          (this->Target->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"\" use a generator expression that depends on the SOURCES themselves.",0x44
                );
      this_00 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      r = cmTarget::GetBacktrace(this->Target);
      cmListFileBacktrace::cmListFileBacktrace(&local_1b8,r);
      cmake::IssueMessage(this_00,FATAL_ERROR,&local_1f8,&local_1b8);
      cmListFileBacktrace::~cmListFileBacktrace(&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if (GetKindedSources(std::__cxx11::string_const&)::empty == '\0') {
        GetKindedSources();
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
      files = &GetKindedSources::empty;
    }
    else {
      files = (KindedSources *)(iVar1._M_node + 2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  return files;
}

Assistant:

cmGeneratorTarget::KindedSources const& cmGeneratorTarget::GetKindedSources(
  std::string const& config) const
{
  // If we already processed one configuration and found no dependenc
  // on configuration then always use the one result.
  if (!this->LinkImplementationLanguageIsContextDependent) {
    return this->KindedSourcesMap.begin()->second;
  }

  // Lookup any existing link implementation for this configuration.
  std::string const key = cmSystemTools::UpperCase(config);
  KindedSourcesMapType::iterator it = this->KindedSourcesMap.find(key);
  if (it != this->KindedSourcesMap.end()) {
    if (!it->second.Initialized) {
      std::ostringstream e;
      e << "The SOURCES of \"" << this->GetName()
        << "\" use a generator expression that depends on the "
           "SOURCES themselves.";
      this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
        cmake::FATAL_ERROR, e.str(), this->GetBacktrace());
      static KindedSources empty;
      return empty;
    }
    return it->second;
  }

  // Add an entry to the map for this configuration.
  KindedSources& files = this->KindedSourcesMap[key];
  this->ComputeKindedSources(files, config);
  files.Initialized = true;
  return files;
}